

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void on_cbs_open_complete(void *context,CBS_OPEN_COMPLETE_RESULT open_complete_result)

{
  char *__s;
  
  __s = "CBS instance open failed.\r";
  if (open_complete_result == CBS_OPEN_OK) {
    __s = "CBS instance open.\r";
  }
  puts(__s);
  return;
}

Assistant:

static void on_cbs_open_complete(void* context, CBS_OPEN_COMPLETE_RESULT open_complete_result)
{
    (void)context;
    switch (open_complete_result)
    {
    default:
        (void)printf("CBS instance open failed.\r\n");
        break;

    case CBS_OPEN_OK:
        (void)printf("CBS instance open.\r\n");
        break;
    }
}